

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayUpdate(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar3;
  ColumnList *pCVar4;
  reference other;
  undefined4 extraout_var_01;
  InternalException *pIVar5;
  TableCatalogEntry *table;
  optional_ptr<duckdb::TableCatalogEntry,_true> *poVar6;
  long lVar7;
  vector<unsigned_long,_true> column_path;
  type row_ids;
  DataChunk chunk;
  vector<unsigned_long,_true> local_f8;
  Vector local_d8;
  DataChunk local_70;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])
            (deserializer,0x65,"column_indexes");
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  iVar2 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[8])(deserializer);
  lVar7 = CONCAT44(extraout_var,iVar2);
  if (lVar7 != 0) {
    do {
      iVar2 = (*(deserializer->super_Deserializer)._vptr_Deserializer[0x15])(deserializer);
      local_d8._0_8_ = CONCAT44(extraout_var_00,iVar2);
      if (local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,
                   (iterator)
                   local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&local_d8);
      }
      else {
        *local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_d8._0_8_;
        local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[9])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  DataChunk::DataChunk(&local_70);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[2])(deserializer,0x66,"chunk");
  (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
  DataChunk::Deserialize(&local_70,&deserializer->super_Deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    if ((this->state->current_table).ptr == (TableCatalogEntry *)0x0) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = &local_d8.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Corrupt WAL: update without table","");
      InternalException::InternalException(pIVar5,(string *)&local_d8);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<unsigned_long,_true>::operator[](&local_f8,0);
    uVar1 = *pvVar3;
    poVar6 = &this->state->current_table;
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(poVar6);
    pCVar4 = TableCatalogEntry::GetColumns(poVar6->ptr);
    if ((ulong)((long)(pCVar4->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pCVar4->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar1) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = &local_d8.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Corrupt WAL: column index for update out of bounds","");
      InternalException::InternalException(pIVar5,(string *)&local_d8);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    other = vector<duckdb::Vector,_true>::back(&local_70.data);
    Vector::Vector(&local_d8,other);
    table = (TableCatalogEntry *)
            (local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
    local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)table;
    __gnu_cxx::new_allocator<duckdb::Vector>::destroy<duckdb::Vector>
              ((new_allocator<duckdb::Vector> *)&local_70,(Vector *)table);
    poVar6 = &this->state->current_table;
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(poVar6);
    iVar2 = (*(poVar6->ptr->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])();
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&this->state->current_table);
    DataTable::UpdateColumn
              ((DataTable *)CONCAT44(extraout_var_01,iVar2),table,this->context,&local_d8,&local_f8,
               &local_70);
    if (local_d8.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d8.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_d8 + 8));
  }
  DataChunk::~DataChunk(&local_70);
  if (local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayUpdate() {
	auto column_path = deserializer.ReadProperty<vector<column_t>>(101, "column_indexes");

	DataChunk chunk;
	deserializer.ReadObject(102, "chunk", [&](Deserializer &object) { chunk.Deserialize(object); });

	if (DeserializeOnly()) {
		return;
	}
	if (!state.current_table) {
		throw InternalException("Corrupt WAL: update without table");
	}

	if (column_path[0] >= state.current_table->GetColumns().PhysicalColumnCount()) {
		throw InternalException("Corrupt WAL: column index for update out of bounds");
	}

	// remove the row id vector from the chunk
	auto row_ids = std::move(chunk.data.back());
	chunk.data.pop_back();

	// now perform the update
	state.current_table->GetStorage().UpdateColumn(*state.current_table, context, row_ids, column_path, chunk);
}